

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O2

int __thiscall IdentifierExp::eval(IdentifierExp *this,EvalState *state)

{
  bool bVar1;
  int iVar2;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)&this->name);
  bVar1 = EvalState::isDefined(state,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_80,"VARIABLE NOT DEFINED",&local_81);
    error(&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::string((string *)&local_60,(string *)&this->name);
  iVar2 = EvalState::getValue(state,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return iVar2;
}

Assistant:

int IdentifierExp::eval(EvalState & state) {
   if (!state.isDefined(name)) error("VARIABLE NOT DEFINED");
   return state.getValue(name);
}